

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

void __thiscall
primesieve::Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::
reserve_unchecked(Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>
                  *this,size_t n)

{
  unsigned_long *puVar1;
  SievingPrime **__result;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *in_RDI;
  SievingPrime **old;
  size_t new_capacity;
  size_t old_capacity;
  size_t old_size;
  SievingPrime **in_stack_ffffffffffffff78;
  undefined1 *__n;
  new_allocator<primesieve::SievingPrime_*> *in_stack_ffffffffffffff90;
  unsigned_long in_stack_ffffffffffffff98;
  SievingPrime **in_stack_ffffffffffffffa0;
  undefined1 local_51;
  SievingPrime **local_50;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  unsigned_long local_30 [2];
  SievingPrime **local_20;
  size_t local_18;
  SievingPrime **local_10;
  
  local_38 = size(in_RDI);
  local_40 = capacity(in_RDI);
  local_48 = local_40 * 3 >> 1;
  puVar1 = std::max<unsigned_long>(&local_48,local_30);
  local_48 = *puVar1;
  local_50 = in_RDI->array_;
  __n = &local_51;
  std::allocator<primesieve::SievingPrime_*>::allocator
            ((allocator<primesieve::SievingPrime_*> *)0x1d0eeb);
  __result = __gnu_cxx::new_allocator<primesieve::SievingPrime_*>::allocate
                       (in_stack_ffffffffffffff90,(size_type)__n,in_RDI);
  in_RDI->array_ = __result;
  std::allocator<primesieve::SievingPrime_*>::~allocator
            ((allocator<primesieve::SievingPrime_*> *)0x1d0f1c);
  in_RDI->end_ = in_RDI->array_ + local_38;
  in_RDI->capacity_ = in_RDI->array_ + local_48;
  if (local_50 != (SievingPrime **)0x0) {
    local_20 = in_RDI->array_;
    local_10 = local_50;
    local_18 = local_38;
    std::uninitialized_copy_n<primesieve::SievingPrime**,unsigned_long,primesieve::SievingPrime**>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,__result);
    std::allocator<primesieve::SievingPrime_*>::allocator
              ((allocator<primesieve::SievingPrime_*> *)0x1d0f9a);
    __gnu_cxx::new_allocator<primesieve::SievingPrime_*>::deallocate
              ((new_allocator<primesieve::SievingPrime_*> *)in_RDI,in_stack_ffffffffffffff78,
               0x1d0fae);
    std::allocator<primesieve::SievingPrime_*>::~allocator
              ((allocator<primesieve::SievingPrime_*> *)0x1d0fb8);
  }
  return;
}

Assistant:

void reserve_unchecked(std::size_t n)
  {
    ASSERT(n > capacity());
    ASSERT(size() <= capacity());
    std::size_t old_size = size();
    std::size_t old_capacity = capacity();

    // GCC & Clang's std::vector grow the capacity by at least
    // 2x for every call to resize() with n > capacity(). We
    // grow by at least 1.5x as we tend to accurately calculate
    // the amount of memory we need upfront.
    std::size_t new_capacity = (old_capacity * 3) / 2;
    new_capacity = std::max(new_capacity, n);
    ASSERT(old_capacity < new_capacity);

    T* old = array_;
    array_ = Allocator().allocate(new_capacity);
    end_ = array_ + old_size;
    capacity_ = array_ + new_capacity;
    ASSERT(size() < capacity());

    // Both primesieve & primecount require that byte arrays are
    // aligned to at least a alignof(uint64_t) boundary. This is
    // needed because our code casts byte arrays into uint64_t arrays
    // in some places in order to improve performance. The default
    // allocator guarantees that each memory allocation is at least
    // aligned to the largest built-in type (usually 16 or 32).
    ASSERT(((uintptr_t) (void*) array_) % sizeof(uint64_t) == 0);

    if (old)
    {
      static_assert(std::is_nothrow_move_constructible<T>::value,
                    "Vector<T> only supports nothrow moveable types!");

      uninitialized_move_n(old, old_size, array_);
      Allocator().deallocate(old, old_capacity);
    }
  }